

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O1

int __thiscall
Timer::
run_repeated<void(&)(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,int),std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,int&>
          (Timer *this,int ms_time,int repeated_num,
          _func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
          *f,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *args,int *args_1)

{
  atomic<int> *paVar1;
  function<void_()> *this_00;
  int iVar2;
  long lVar3;
  unique_lock<std::mutex> lock;
  TimerNode s;
  _Bind<void_(*(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int))(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int)>
  local_90;
  value_type local_78;
  
  local_78.tn_is_period = false;
  local_78.tn_is_repeated = false;
  local_78.tn_tm_point.__d.__r = (duration)0;
  local_78.tn_callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.tn_callback.super__Function_base._M_functor._8_8_ = 0;
  local_78.tn_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  local_78.tn_callback._M_invoker = (_Invoker_type)0x0;
  LOCK();
  paVar1 = &this->tm_id;
  local_78.tn_id = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_90._M_f =
       (_func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
        *)((ulong)local_90._M_f & 0xffffffff00000000);
  hash_map<int,_Timer::IdState>::emplace
            (&this->tm_id_state_map,&local_78.tn_id,(IdState *)&local_90);
  this_00 = &local_78.tn_callback;
  local_78.tn_is_repeated = true;
  local_78.tn_period.__r = (rep)ms_time;
  local_78.tn_repeated_num = repeated_num;
  lVar3 = std::chrono::_V2::system_clock::now();
  local_78.tn_tm_point.__d.__r = (duration)(local_78.tn_period.__r * 1000000 + lVar3);
  local_90._M_bound_args.
  super__Tuple_impl<0UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int>
  .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)*args_1;
  local_90._M_bound_args.
  super__Tuple_impl<0UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int>
  .
  super__Head_base<0UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false>
  ._M_head_impl.__d.__r =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        )(args->__d).__r;
  local_90._M_f = f;
  std::function<void()>::operator=((function<void()> *)this_00,&local_90);
  local_90._M_f =
       (_func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
        *)&this->tm_mutex;
  local_90._M_bound_args.
  super__Tuple_impl<0UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int>
  .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)
       ((uint)local_90._M_bound_args.
              super__Tuple_impl<0UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int>
              .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl &
       0xffffff00);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_90);
  local_90._M_bound_args.
  super__Tuple_impl<0UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int>
  .super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl._0_1_ = 1;
  std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>::push_back
            ((vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_> *)this,&local_78);
  std::
  push_heap<__gnu_cxx::__normal_iterator<Timer::TimerNode*,std::vector<Timer::TimerNode,std::allocator<Timer::TimerNode>>>,std::less<Timer::TimerNode>>
            ((this->tm_queue).c.
             super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->tm_queue).c.
             super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::condition_variable::notify_all();
  iVar2 = local_78.tn_id;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_90);
  if (local_78.tn_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.tn_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return iVar2;
}

Assistant:

int run_repeated(int ms_time, int repeated_num, F&& f, Args&&... args)
    {
        TimerNode s;
        s.tn_id = tm_id.fetch_add(1);
        tm_id_state_map.emplace(s.tn_id, IdState::Running);
        s.tn_is_repeated = true;
        s.tn_repeated_num = repeated_num;
        s.tn_period = chrono::milliseconds(ms_time);
        s.tn_tm_point = chrono::high_resolution_clock::now() + s.tn_period;
        // TODO: use lamda, tuple and apply of C++17 replacing bind
        s.tn_callback = bind(forward<F>(f), forward<Args>(args)...);
        unique_lock<mutex> lock(tm_mutex);
        tm_queue.push(s);
        tm_cond.notify_all();   

        return s.tn_id; 
    }